

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

SchemaAttDef * __thiscall
xercesc_4_0::TraverseSchema::traverseAnyAttribute(TraverseSchema *this,DOMElement *elem)

{
  SchemaGrammar *this_00;
  XMLException *pXVar1;
  SchemaInfo *rootElem;
  bool bVar2;
  DOMElement *pDVar3;
  XMLCh *pXVar4;
  XMLCh *str1;
  ValidationContext *pVVar5;
  SchemaAttDef *this_01;
  XSAnnotation *pXVar6;
  XMLSize_t XVar7;
  SchemaAttDef *attDef;
  XMLException *excep;
  XMLCh *token;
  DatatypeValidator *anyURIDV;
  XMLStringTokenizer tokenizer;
  ValueVectorOf<unsigned_int> namespaceList;
  int local_58;
  AttTypes attType;
  int uriIndex;
  DefAttTypes attDefType;
  XMLCh *nameSpace;
  XMLCh *processContents;
  Janitor<xercesc_4_0::XSAnnotation> janAnnot;
  undefined1 local_28 [8];
  NamespaceScopeManager nsMgr;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo = (SchemaInfo *)elem;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)local_28,elem,this->fSchemaInfo,this);
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,(DOMElement *)nsMgr.fSchemaInfo,3,this,false,this->fNonXSAttList
            );
  rootElem = nsMgr.fSchemaInfo;
  pDVar3 = XUtil::getFirstChildElement((DOMNode *)nsMgr.fSchemaInfo);
  pDVar3 = checkContent(this,(DOMElement *)rootElem,pDVar3,true,true);
  if (pDVar3 != (DOMElement *)0x0) {
    reportSchemaError(this,(DOMElement *)nsMgr.fSchemaInfo,(XMLCh *)XMLUni::fgXMLErrDomain,0x54);
  }
  bVar2 = XMLScanner::getGenerateSyntheticAnnotations(this->fScanner);
  if (((bVar2) && (this->fAnnotation == (XSAnnotation *)0x0)) &&
     (XVar7 = ValueVectorOf<xercesc_4_0::DOMNode_*>::size(this->fNonXSAttList), XVar7 != 0)) {
    pXVar6 = generateSyntheticAnnotation(this,(DOMElement *)nsMgr.fSchemaInfo,this->fNonXSAttList);
    this->fAnnotation = pXVar6;
  }
  Janitor<xercesc_4_0::XSAnnotation>::Janitor
            ((Janitor<xercesc_4_0::XSAnnotation> *)&processContents,this->fAnnotation);
  pXVar4 = getElementAttValue(this,(DOMElement *)nsMgr.fSchemaInfo,
                              (XMLCh *)SchemaSymbols::fgATT_PROCESSCONTENTS,UnKnown);
  str1 = getElementAttValue(this,(DOMElement *)nsMgr.fSchemaInfo,
                            (XMLCh *)SchemaSymbols::fgATT_NAMESPACE,UnKnown);
  attType = NmTokens;
  if (((pXVar4 != (XMLCh *)0x0) && (*pXVar4 != L'\0')) &&
     (bVar2 = XMLString::equals(pXVar4,(XMLCh *)SchemaSymbols::fgATTVAL_STRICT), !bVar2)) {
    bVar2 = XMLString::equals(pXVar4,(XMLCh *)SchemaSymbols::fgATTVAL_SKIP);
    if (bVar2) {
      attType = Entities;
    }
    else {
      bVar2 = XMLString::equals(pXVar4,L"lax");
      if (bVar2) {
        attType = NmToken;
      }
    }
  }
  local_58 = this->fEmptyNamespaceURI;
  namespaceList.fMemoryManager._4_4_ = Any_Any;
  ValueVectorOf<unsigned_int>::ValueVectorOf
            ((ValueVectorOf<unsigned_int> *)&tokenizer.fMemoryManager,8,
             this->fGrammarPoolMemoryManager,false);
  if (((str1 != (XMLCh *)0x0) && (*str1 != L'\0')) &&
     (bVar2 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgATTVAL_TWOPOUNDANY), !bVar2)) {
    bVar2 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgATTVAL_TWOPOUNDOTHER);
    if (bVar2) {
      namespaceList.fMemoryManager._4_4_ = Any_Other;
      local_58 = this->fTargetNSURI;
    }
    else {
      XMLStringTokenizer::XMLStringTokenizer
                ((XMLStringTokenizer *)&anyURIDV,str1,this->fGrammarPoolMemoryManager);
      token = (XMLCh *)DatatypeValidatorFactory::getDatatypeValidator
                                 (this->fDatatypeRegistry,(XMLCh *)SchemaSymbols::fgDT_ANYURI);
      namespaceList.fMemoryManager._4_4_ = Any_List;
      while (bVar2 = XMLStringTokenizer::hasMoreTokens((XMLStringTokenizer *)&anyURIDV), bVar2) {
        excep = (XMLException *)XMLStringTokenizer::nextToken((XMLStringTokenizer *)&anyURIDV);
        bVar2 = XMLString::equals((XMLCh *)excep,(XMLCh *)SchemaSymbols::fgATTVAL_TWOPOUNDLOCAL);
        if (bVar2) {
          local_58 = this->fEmptyNamespaceURI;
        }
        else {
          bVar2 = XMLString::equals((XMLCh *)excep,
                                    (XMLCh *)SchemaSymbols::fgATTVAL_TWOPOUNDTRAGETNAMESPACE);
          pXVar4 = token;
          pXVar1 = excep;
          if (bVar2) {
            local_58 = this->fTargetNSURI;
          }
          else {
            pVVar5 = SchemaInfo::getValidationContext(this->fSchemaInfo);
            (**(code **)(*(long *)pXVar4 + 0x40))(pXVar4,pXVar1,pVVar5,this->fMemoryManager);
            local_58 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                                 (this->fURIStringPool,excep);
          }
        }
        attDef._4_4_ = local_58;
        bVar2 = ValueVectorOf<unsigned_int>::containsElement
                          ((ValueVectorOf<unsigned_int> *)&tokenizer.fMemoryManager,
                           (uint *)((long)&attDef + 4),0);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          attDef._0_4_ = local_58;
          ValueVectorOf<unsigned_int>::addElement
                    ((ValueVectorOf<unsigned_int> *)&tokenizer.fMemoryManager,(uint *)&attDef);
        }
      }
      local_58 = this->fEmptyNamespaceURI;
      XMLStringTokenizer::~XMLStringTokenizer((XMLStringTokenizer *)&anyURIDV);
    }
  }
  this_01 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
  SchemaAttDef::SchemaAttDef
            (this_01,L"",L"",local_58,namespaceList.fMemoryManager._4_4_,attType,
             this->fGrammarPoolMemoryManager);
  bVar2 = Janitor<xercesc_4_0::XSAnnotation>::isDataNull
                    ((Janitor<xercesc_4_0::XSAnnotation> *)&processContents);
  if (!bVar2) {
    this_00 = this->fSchemaGrammar;
    pXVar6 = Janitor<xercesc_4_0::XSAnnotation>::release
                       ((Janitor<xercesc_4_0::XSAnnotation> *)&processContents);
    SchemaGrammar::putAnnotation(this_00,this_01,pXVar6);
  }
  XVar7 = ValueVectorOf<unsigned_int>::size
                    ((ValueVectorOf<unsigned_int> *)&tokenizer.fMemoryManager);
  if (XVar7 != 0) {
    SchemaAttDef::setNamespaceList(this_01,(ValueVectorOf<unsigned_int> *)&tokenizer.fMemoryManager)
    ;
  }
  ValueVectorOf<unsigned_int>::~ValueVectorOf
            ((ValueVectorOf<unsigned_int> *)&tokenizer.fMemoryManager);
  Janitor<xercesc_4_0::XSAnnotation>::~Janitor
            ((Janitor<xercesc_4_0::XSAnnotation> *)&processContents);
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)local_28);
  return this_01;
}

Assistant:

SchemaAttDef* TraverseSchema::traverseAnyAttribute(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_AnyAttribute, this, false, fNonXSAttList
    );

    // ------------------------------------------------------------------
    // First, handle any ANNOTATION declaration
    // ------------------------------------------------------------------
    if (checkContent(elem, XUtil::getFirstChildElement(elem), true) != 0) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AnyAttributeContentError);
    }
    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
    }
    Janitor<XSAnnotation> janAnnot(fAnnotation);
    // ------------------------------------------------------------------
    // Get attributes
    // ------------------------------------------------------------------
    const XMLCh* const processContents = getElementAttValue(elem, SchemaSymbols::fgATT_PROCESSCONTENTS);
    const XMLCh* const nameSpace = getElementAttValue(elem, SchemaSymbols::fgATT_NAMESPACE);

    // ------------------------------------------------------------------
    // Set default att type based on 'processContents' value
    // ------------------------------------------------------------------
    XMLAttDef::DefAttTypes attDefType = XMLAttDef::ProcessContents_Strict;

    if ((!processContents || !*processContents)
        || XMLString::equals(processContents, SchemaSymbols::fgATTVAL_STRICT)) {
        // Do nothing - defaulted already
    }
    else if (XMLString::equals(processContents, SchemaSymbols::fgATTVAL_SKIP)) {
        attDefType = XMLAttDef::ProcessContents_Skip;
    }
    else if (XMLString::equals(processContents, SchemaSymbols::fgATTVAL_LAX)) {
        attDefType = XMLAttDef::ProcessContents_Lax;
    }

    // ------------------------------------------------------------------
    // Process 'namespace' attribute
    // ------------------------------------------------------------------
    int uriIndex = fEmptyNamespaceURI;
    XMLAttDef::AttTypes attType = XMLAttDef::Any_Any;
    ValueVectorOf<unsigned int> namespaceList(8, fGrammarPoolMemoryManager);

    if ((!nameSpace || !*nameSpace)
        || XMLString::equals(nameSpace, SchemaSymbols::fgATTVAL_TWOPOUNDANY)) {
        // Do nothing - defaulted already
    }
    else if (XMLString::equals(nameSpace, SchemaSymbols::fgATTVAL_TWOPOUNDOTHER)) {

        attType = XMLAttDef::Any_Other;
        uriIndex = fTargetNSURI;
    }
    else {

        XMLStringTokenizer tokenizer(nameSpace, fGrammarPoolMemoryManager);
        DatatypeValidator* anyURIDV = fDatatypeRegistry->getDatatypeValidator(SchemaSymbols::fgDT_ANYURI);

        attType = XMLAttDef::Any_List;

        while (tokenizer.hasMoreTokens()) {

            const XMLCh* token = tokenizer.nextToken();

            if (XMLString::equals(token, SchemaSymbols::fgATTVAL_TWOPOUNDLOCAL)) {
                uriIndex = fEmptyNamespaceURI;
            }
            else if (XMLString::equals(token, SchemaSymbols::fgATTVAL_TWOPOUNDTRAGETNAMESPACE)) {
                uriIndex = fTargetNSURI;
            }
            else {

                try {
                    anyURIDV->validate(token
                                     , fSchemaInfo->getValidationContext()
                                     , fMemoryManager);
                }
                catch(const XMLException& excep) {
                    reportSchemaError(elem, excep);
                }
                uriIndex = fURIStringPool->addOrFind(token);
            }

            if (!namespaceList.containsElement(uriIndex)) {
                namespaceList.addElement(uriIndex);
            }
        }

        uriIndex = fEmptyNamespaceURI;
    }

    // ------------------------------------------------------------------
    // Create wildcard attribute
    // ------------------------------------------------------------------
    SchemaAttDef* attDef = new (fGrammarPoolMemoryManager) SchemaAttDef(XMLUni::fgZeroLenString,
                                            XMLUni::fgZeroLenString,
                                            uriIndex, attType, attDefType,
                                            fGrammarPoolMemoryManager);

    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(attDef, janAnnot.release());

    if (namespaceList.size()) {
       attDef->setNamespaceList(&namespaceList);
    }

    return attDef;
}